

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void create_decl(c2m_ctx_t c2m_ctx,node_t_conflict scope,node_t_conflict decl_node,
                decl_spec decl_spec,node_t_conflict initializer,int param_p)

{
  decl_spec *decl_spec_00;
  byte bVar1;
  check_ctx *pcVar2;
  check_ctx *pcVar3;
  FILE *__stream;
  node_t pnVar4;
  node_t pnVar5;
  uint uVar6;
  int iVar7;
  decl_t pdVar8;
  type *ptVar9;
  node_t_conflict pnVar10;
  decl_t *ppdVar11;
  node_t_conflict pnVar12;
  size_t sVar13;
  char *pcVar14;
  type **type_ptr;
  long extraout_RDX;
  node_t r;
  node_t pnVar15;
  decl_t member_decl;
  c2m_ctx_t c2m_ctx_00;
  node_code_t in_R9D;
  node_t pnVar16;
  ulong uVar17;
  undefined8 uVar18;
  bool bVar19;
  pos_t pVar20;
  long lVar21;
  VARR_decl_t *pVVar22;
  node_t_conflict local_68;
  
  pcVar2 = c2m_ctx->check_ctx;
  bVar19 = decl_node->code == N_FUNC_DEF;
  pdVar8 = (decl_t)reg_malloc(c2m_ctx,0x60);
  uVar6 = decl_node->code - N_SPEC_DECL;
  if ((0x28 < uVar6) || ((0x10000800001U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
    __assert_fail("decl_node->code == N_MEMBER || decl_node->code == N_SPEC_DECL || decl_node->code == N_FUNC_DEF"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1ec9,
                  "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
  }
  pcVar3 = c2m_ctx->check_ctx;
  *(byte *)pdVar8 = *(byte *)pdVar8 & 0xf0;
  pdVar8->offset = 0;
  pdVar8->bit_offset = -1;
  pdVar8->param_args_start = 0;
  pdVar8->param_args_num = 0;
  pdVar8->scope = pcVar3->curr_scope;
  pdVar8->containing_unnamed_anon_struct_union_member =
       pcVar3->curr_unnamed_anon_struct_union_member;
  (pdVar8->u).asm_str = (char *)0x0;
  pdVar8->c2m_ctx = c2m_ctx;
  pdVar8->scope = scope;
  *(undefined4 *)&(pdVar8->decl_spec).field_0x0 = decl_spec._0_4_;
  (pdVar8->decl_spec).align = decl_spec.align;
  (pdVar8->decl_spec).align_node = decl_spec.align_node;
  (pdVar8->decl_spec).linkage = decl_spec.linkage;
  *(undefined4 *)&(pdVar8->decl_spec).field_0x14 = decl_spec._20_4_;
  (pdVar8->decl_spec).type = decl_spec.type;
  decl_node->attr = pdVar8;
  r = (decl_node->u).ops.head;
  if (r != (node_t)0x0) {
    r = (r->op_link).next;
  }
  pnVar12 = (node_t_conflict)(ulong)bVar19;
  uVar6 = (uint)bVar19;
  if (r->code == N_DECL) {
    ptVar9 = check_declarator(c2m_ctx,r,uVar6);
    ptVar9 = append_type(ptVar9,(pdVar8->decl_spec).type);
    (pdVar8->decl_spec).type = ptVar9;
  }
  else {
    if (r->code != N_IGNORE) {
      __assert_fail("declarator->code == N_DECL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1ed3,
                    "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
    }
    if (decl_node->code != N_MEMBER) {
      __assert_fail("decl_node->code == N_MEMBER",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1ed0,
                    "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
    }
    (pdVar8->decl_spec).linkage = N_IGNORE;
  }
  decl_spec_00 = &pdVar8->decl_spec;
  bVar19 = false;
  check_type(c2m_ctx,(pdVar8->decl_spec).type,0,uVar6);
  if (r->code == N_DECL) {
    local_68 = (r->u).ops.head;
    if ((param_p == 0) &&
       (pnVar15 = (((local_68->op_link).next)->u).ops.head, pnVar15 != (node_t)0x0)) {
      bVar19 = pnVar15->code == N_FUNC;
    }
    bVar1 = decl_spec_00->field_0x0;
    uVar17 = 0;
    pnVar12 = scope;
    pnVar10 = find_def(c2m_ctx,S_REGULAR,local_68,scope,(node_t_conflict *)0x0);
    if ((bVar1 & 1) == 0) {
      if (((bVar1 & 4) == 0) || (pnVar12 = scope, c2m_ctx->top_scope != scope)) {
        if (((bVar1 & 2) != 0) && (pnVar10 != (node_t_conflict)0x0)) {
          pnVar12 = (node_t_conflict)pnVar10->attr;
          uVar17 = (ulong)*(uint *)&pnVar12[1].attr;
          if (*(uint *)&pnVar12[1].attr != 0) goto LAB_00187a85;
        }
        if ((((bVar1 & 2) == 0) ||
            ((uVar17 = 0x58, pnVar10 != (node_t_conflict)0x0 &&
             (*(int *)((long)pnVar10->attr + 0x38) != 0)))) &&
           (((bVar1 & 6) != 0 || ((uVar17 = 0x58, !bVar19 && (c2m_ctx->top_scope != scope)))))) {
          uVar17 = 0;
        }
      }
      else {
        uVar17 = 0x59;
      }
    }
LAB_00187a85:
    (pdVar8->decl_spec).linkage = (node_code_t)uVar17;
    uVar18 = CONCAT71((int7)(uVar17 >> 8),!bVar19);
  }
  else {
    uVar18 = 1;
    local_68 = (node_t_conflict)0x0;
  }
  type_ptr = &(pdVar8->decl_spec).type;
  if (decl_node->code != N_MEMBER) {
    set_type_layout(c2m_ctx,*type_ptr);
    pnVar10 = (node_t_conflict)decl_spec_00;
    check_decl_align(c2m_ctx,decl_spec_00);
    if ((((decl_spec_00->field_0x0 & 1) == 0) && (pdVar8->scope != c2m_ctx->top_scope)) &&
       (pdVar8->scope->code != N_FUNC)) {
      pVVar22 = pcVar2->func_decls_for_allocation;
      c2m_ctx_00 = (c2m_ctx_t)pVVar22->varr;
      if (c2m_ctx_00 == (c2m_ctx_t)0x0) {
        create_decl_cold_1();
        if (pnVar12->code != N_IGNORE) {
          if (pnVar12->code != N_LIST) {
            __assert_fail("attrs->code == N_LIST",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x20d1,"const char *check_attrs(c2m_ctx_t, node_t, decl_t, node_t, int)")
            ;
          }
          pnVar15 = (pnVar12->u).ops.head;
          lVar21 = extraout_RDX;
          if (pnVar15 == (node_t)0x0) {
            pnVar16 = (node_t)0x0;
          }
          else {
            pnVar16 = (node_t)0x0;
            do {
              if (pnVar15->code != N_ATTR) {
                __assert_fail("n->code == N_ATTR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x20d4,
                              "const char *check_attrs(c2m_ctx_t, node_t, decl_t, node_t, int)");
              }
              pnVar4 = (pnVar15->u).ops.head;
              if (pnVar4->code != N_ID) {
                __assert_fail("id->code == N_ID",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x20d6,
                              "const char *check_attrs(c2m_ctx_t, node_t, decl_t, node_t, int)");
              }
              iVar7 = strcmp((pnVar4->u).s.s,"antialias");
              pnVar5 = pnVar16;
              if (iVar7 == 0) {
                pnVar4 = (pnVar4->op_link).next;
                if (pnVar4->code != N_LIST) {
                  __assert_fail("list->code == N_LIST",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                ,0x20d9,
                                "const char *check_attrs(c2m_ctx_t, node_t, decl_t, node_t, int)");
                }
                pnVar4 = (pnVar4->u).ops.head;
                if (pnVar4 != (node_t)0x0) {
                  pnVar5 = pnVar4;
                  if ((pnVar4->op_link).next == (node_t)0x0) {
                    if (pnVar4->code == N_ID) {
                      if ((pnVar16 != (node_t)0x0) &&
                         (iVar7 = strcmp((pnVar4->u).s.s,(pnVar16->u).s.s), iVar7 != 0)) {
                        pVar20 = get_node_pos(c2m_ctx_00,pnVar10);
                        error(c2m_ctx_00,0x1c202d,pVar20.fname,pVar20._8_8_,(pnVar4->u).s.s,
                              (pnVar16->u).s.s,lVar21,c2m_ctx,decl_node,pVVar22,uVar18,pdVar8,r);
                      }
                      goto LAB_00187e4e;
                    }
                    pVar20 = get_node_pos(c2m_ctx_00,pnVar10);
                    pcVar14 = "antialias attribute arg should be an identifier";
                  }
                  else {
                    pVar20 = get_node_pos(c2m_ctx_00,pnVar10);
                    pcVar14 = "antialias attribute has more one arg";
                  }
                  error(c2m_ctx_00,pcVar14,pVar20.fname,pVar20._8_8_);
                }
              }
LAB_00187e4e:
              pnVar16 = pnVar5;
              pnVar15 = (pnVar15->op_link).next;
            } while (pnVar15 != (node_t)0x0);
          }
          if ((pnVar16 != (node_t)0x0) && (*(int *)(*(long *)(lVar21 + 0x40) + 0x18) != 3)) {
            pVar20 = get_node_pos(c2m_ctx_00,pnVar10);
            error(c2m_ctx_00,0x1c205f,pVar20.fname,pVar20._8_8_);
          }
        }
        return;
      }
      uVar17 = pVVar22->els_num + 1;
      if (pVVar22->size < uVar17) {
        sVar13 = (uVar17 >> 1) + uVar17;
        ppdVar11 = (decl_t *)realloc(c2m_ctx_00,sVar13 * 8);
        pVVar22->varr = ppdVar11;
        pVVar22->size = sVar13;
      }
      sVar13 = pVVar22->els_num;
      pVVar22->els_num = sVar13 + 1;
      pVVar22->varr[sVar13] = pdVar8;
    }
  }
  if (r->code == N_DECL) {
    def_symbol(c2m_ctx,(symbol_mode)local_68,scope,decl_node,
               (node_t_conflict)(ulong)(pdVar8->decl_spec).linkage,in_R9D);
    if ((c2m_ctx->top_scope != scope) && ((pdVar8->decl_spec).linkage == N_EXTERN)) {
      def_symbol(c2m_ctx,(symbol_mode)local_68,c2m_ctx->top_scope,decl_node,
                 (node_t_conflict)&DAT_00000058,in_R9D);
    }
    if (((char)uVar18 == '\0') && ((decl_spec_00->field_0x0 & 0x20) != 0)) {
      pVar20 = get_node_pos(c2m_ctx,local_68);
      error(c2m_ctx,0x1c1cbb,pVar20.fname,pVar20._8_8_);
      __stream = (FILE *)c2m_ctx->options->message_file;
      if (__stream != (FILE *)0x0) {
        if (local_68->code != N_IGNORE) {
          fprintf(__stream," of %s",(local_68->u).s.s);
        }
        fputc(10,(FILE *)c2m_ctx->options->message_file);
      }
    }
  }
  if ((initializer == (node_t_conflict)0x0) || (initializer->code == N_IGNORE)) {
    return;
  }
  ptVar9 = *type_ptr;
  iVar7 = incomplete_type_p(c2m_ctx,ptVar9);
  if (iVar7 == 0) {
LAB_00187c9c:
    if (((pdVar8->decl_spec).linkage == N_EXTERN) && (c2m_ctx->top_scope != scope)) {
      pVar20 = get_node_pos(c2m_ctx,initializer);
      error(c2m_ctx,0x1c1d2f,pVar20.fname,pVar20._8_8_,(local_68->u).s.s);
      return;
    }
    member_decl = (decl_t)initializer;
    check(c2m_ctx,initializer,decl_node);
    uVar6 = 1;
    if ((((pdVar8->decl_spec).linkage & ~N_I) != N_EXTERN) &&
       ((decl_spec_00->field_0x0 & 0x20) == 0)) {
      uVar6 = (byte)decl_spec_00->field_0x0 >> 2 & 1;
    }
    check_initializer(c2m_ctx,member_decl,type_ptr,initializer,uVar6,1);
    return;
  }
  if (ptVar9->mode == TM_ARR) {
    iVar7 = incomplete_type_p(c2m_ctx,((ptVar9->u).ptr_type)->arr_type);
    if (iVar7 == 0) goto LAB_00187c9c;
    if (((ptVar9->u).ptr_type)->arr_type->mode == TM_ARR) {
      pVar20 = get_node_pos(c2m_ctx,initializer);
      pcVar14 = "initialization of incomplete sub-array";
      goto LAB_00187cf9;
    }
  }
  pVar20 = get_node_pos(c2m_ctx,initializer);
  pcVar14 = "initialization of incomplete type variable";
LAB_00187cf9:
  error(c2m_ctx,pcVar14,pVar20.fname,pVar20._8_8_);
  return;
}

Assistant:

static void create_decl (c2m_ctx_t c2m_ctx, node_t scope, node_t decl_node,
                         struct decl_spec decl_spec, node_t initializer, int param_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  int func_def_p = decl_node->code == N_FUNC_DEF, func_p = FALSE;
  node_t id = NULL; /* to remove an uninitialized warning */
  node_t list_head, declarator;
  struct type *type;
  decl_t decl = reg_malloc (c2m_ctx, sizeof (struct decl));

  assert (decl_node->code == N_MEMBER || decl_node->code == N_SPEC_DECL
          || decl_node->code == N_FUNC_DEF);
  init_decl (c2m_ctx, decl);
  decl->scope = scope;
  decl->decl_spec = decl_spec;
  decl_node->attr = decl;
  declarator = NL_EL (decl_node->u.ops, 1);
  if (declarator->code == N_IGNORE) {
    assert (decl_node->code == N_MEMBER);
    decl->decl_spec.linkage = N_IGNORE;
  } else {
    assert (declarator->code == N_DECL);
    type = check_declarator (c2m_ctx, declarator, func_def_p);
    decl->decl_spec.type = append_type (type, decl->decl_spec.type);
  }
  check_type (c2m_ctx, decl->decl_spec.type, 0, func_def_p);
  if (declarator->code == N_DECL) {
    id = NL_HEAD (declarator->u.ops);
    list_head = NL_HEAD (NL_NEXT (id)->u.ops);
    func_p = !param_p && list_head && list_head->code == N_FUNC;
    decl->decl_spec.linkage = get_id_linkage (c2m_ctx, func_p, id, scope, decl->decl_spec);
  }
  if (decl_node->code != N_MEMBER) {
    set_type_layout (c2m_ctx, decl->decl_spec.type);
    check_decl_align (c2m_ctx, &decl->decl_spec);
    if (!decl->decl_spec.typedef_p && decl->scope != top_scope && decl->scope->code != N_FUNC)
      VARR_PUSH (decl_t, func_decls_for_allocation, decl);
  }
  if (declarator->code == N_DECL) {
    def_symbol (c2m_ctx, S_REGULAR, id, scope, decl_node, decl->decl_spec.linkage);
    if (scope != top_scope && decl->decl_spec.linkage == N_EXTERN)
      def_symbol (c2m_ctx, S_REGULAR, id, top_scope, decl_node, N_EXTERN);
    if (func_p && decl->decl_spec.thread_local_p) {
      error (c2m_ctx, POS (id), "thread local function declaration");
      if (c2m_options->message_file != NULL) {
        if (id->code != N_IGNORE) fprintf (c2m_options->message_file, " of %s", id->u.s.s);
        fprintf (c2m_options->message_file, "\n");
      }
    }
  }
  if (initializer == NULL || initializer->code == N_IGNORE) return;
  if (incomplete_type_p (c2m_ctx, decl->decl_spec.type)
      && (decl->decl_spec.type->mode != TM_ARR
          || incomplete_type_p (c2m_ctx, decl->decl_spec.type->u.arr_type->el_type))) {
    if (decl->decl_spec.type->mode == TM_ARR
        && decl->decl_spec.type->u.arr_type->el_type->mode == TM_ARR)
      error (c2m_ctx, POS (initializer), "initialization of incomplete sub-array");
    else
      error (c2m_ctx, POS (initializer), "initialization of incomplete type variable");
    return;
  }
  if (decl->decl_spec.linkage == N_EXTERN && scope != top_scope) {
    error (c2m_ctx, POS (initializer), "initialization of %s in block scope with external linkage",
           id->u.s.s);
    return;
  }
  check (c2m_ctx, initializer, decl_node);
  check_initializer (c2m_ctx, NULL, &decl->decl_spec.type, initializer,
                     decl->decl_spec.linkage == N_STATIC || decl->decl_spec.linkage == N_EXTERN
                       || decl->decl_spec.thread_local_p || decl->decl_spec.static_p,
                     TRUE);
}